

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedRotaryWingAircraft.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::GED_EnhancedRotaryWingAircraft::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_EnhancedRotaryWingAircraft *this)

{
  ostream *poVar1;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  GED_EnhancedRotaryWingAircraft *local_18;
  GED_EnhancedRotaryWingAircraft *this_local;
  
  local_18 = this;
  this_local = (GED_EnhancedRotaryWingAircraft *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  GED_BasicRotorWingAircraft::GetAsString_abi_cxx11_
            (&local_1c0,&this->super_GED_BasicRotorWingAircraft);
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar1 = std::operator<<(local_190,"GED Enhanced Rotary Wing Aircraft\n");
  poVar1 = std::operator<<(poVar1,"\tFuel Status:               ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(byte)(this->super_GED_BasicRotorWingAircraft).field_0x2c);
  poVar1 = std::operator<<(poVar1,"0 Liters\n");
  poVar1 = std::operator<<(poVar1,"\tAir Maintenance Status:    ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(byte)(this->super_GED_BasicRotorWingAircraft).field_0x2d);
  poVar1 = std::operator<<(poVar1,"0 km\n");
  poVar1 = std::operator<<(poVar1,"\tPrimary Ammunition:        ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(byte)(this->super_GED_BasicRotorWingAircraft).field_0x2e);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSecondary Ammunition:      ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(byte)(this->super_GED_BasicRotorWingAircraft).field_0x2f);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString GED_EnhancedRotaryWingAircraft::GetAsString() const
{
    KStringStream ss;

    ss << GED_BasicRotorWingAircraft::GetAsString();

    ss << "GED Enhanced Rotary Wing Aircraft\n"
       << "\tFuel Status:               " << ( KUINT16 )m_ui8SupFuelStatus   << "0 Liters\n"
       << "\tAir Maintenance Status:    " << ( KUINT16 )m_ui8AirMaintStatus  << "0 km\n"
       << "\tPrimary Ammunition:        " << ( KUINT16 )m_ui8PriAmmun        << "\n"
       << "\tSecondary Ammunition:      " << ( KUINT16 )m_ui8SecAmmun        << "\n";

    return ss.str();
}